

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O2

void cortex_m33_initfn(uc_struct_conflict1 *uc,CPUState *obj)

{
  obj[1].tb_jmp_cache[0x5f3] =
       (TranslationBlock *)((ulong)obj[1].tb_jmp_cache[0x5f3] | 0x6408000200);
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x646) = 0x410fd213;
  *(undefined8 *)((long)obj[1].tb_jmp_cache + 0x3184) = 0x800000010;
  *(undefined8 *)((long)obj[1].tb_jmp_cache + 0x3244) = 0x21000000030;
  obj[1].tb_jmp_cache[0x63a] = (TranslationBlock *)0x1100001110110021;
  obj[1].tb_jmp_cache[0x63b] = (TranslationBlock *)0x20000000000040;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x64c) = 0;
  obj[1].tb_jmp_cache[0x638] = (TranslationBlock *)0x100000000000000;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x639) = 0;
  obj[1].tb_jmp_cache[0x634] = (TranslationBlock *)0x221200001101110;
  obj[1].tb_jmp_cache[0x635] = (TranslationBlock *)0x111113120232232;
  obj[1].tb_jmp_cache[0x636] = (TranslationBlock *)0x1310132;
  obj[1].tb_jmp_cache[0x637] = (TranslationBlock *)0x101f4000000000;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x64f) = 0;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x323c) = 0x8000c000;
  return;
}

Assistant:

static void cortex_m33_initfn(struct uc_struct *uc, CPUState *obj)
{
    ARMCPU *cpu = ARM_CPU(obj);

    set_feature(&cpu->env, ARM_FEATURE_V8);
    set_feature(&cpu->env, ARM_FEATURE_M);
    set_feature(&cpu->env, ARM_FEATURE_M_MAIN);
    set_feature(&cpu->env, ARM_FEATURE_M_SECURITY);
    set_feature(&cpu->env, ARM_FEATURE_THUMB_DSP);
    cpu->midr = 0x410fd213; /* r0p3 */
    cpu->pmsav7_dregion = 16;
    cpu->sau_sregion = 8;
    cpu->isar.mvfr0 = 0x10110021;
    cpu->isar.mvfr1 = 0x11000011;
    cpu->isar.mvfr2 = 0x00000040;
    cpu->id_pfr0 = 0x00000030;
    cpu->id_pfr1 = 0x00000210;
    cpu->isar.id_dfr0 = 0x00200000;
    cpu->id_afr0 = 0x00000000;
    cpu->isar.id_mmfr0 = 0x00101F40;
    cpu->isar.id_mmfr1 = 0x00000000;
    cpu->isar.id_mmfr2 = 0x01000000;
    cpu->isar.id_mmfr3 = 0x00000000;
    cpu->isar.id_isar0 = 0x01101110;
    cpu->isar.id_isar1 = 0x02212000;
    cpu->isar.id_isar2 = 0x20232232;
    cpu->isar.id_isar3 = 0x01111131;
    cpu->isar.id_isar4 = 0x01310132;
    cpu->isar.id_isar5 = 0x00000000;
    cpu->isar.id_isar6 = 0x00000000;
    cpu->clidr = 0x00000000;
    cpu->ctr = 0x8000c000;
}